

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O3

void Cmd_angleconvtest(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined4 in_register_00000014;
  int iVar1;
  double dVar2;
  double dVar3;
  
  Printf("Testing degrees to angle conversion:\n",who,CONCAT44(in_register_00000014,key));
  dVar2 = -900.0;
  iVar1 = -0x3b1;
  do {
    dVar3 = dVar2 * 11930464.711111112;
    Printf("Angle = %.5f: xs_RoundToInt = %08x, unsigned cast = %08x, signed cast = %08x\n",dVar2,
           dVar3 + 6755399441055744.0,(long)dVar3,(ulong)(uint)(int)dVar3);
    dVar2 = dVar2 + 45.0;
    iVar1 = iVar1 + 0x2d;
  } while (iVar1 < 0x357);
  return;
}

Assistant:

CCMD(angleconvtest)
{
	Printf("Testing degrees to angle conversion:\n");
	for (double ang = -5 * 180.; ang < 5 * 180.; ang += 45.)
	{
		unsigned ang1 = DAngle(ang).BAMs();
		unsigned ang2 = (unsigned)(ang * (0x40000000 / 90.));
		unsigned ang3 = (unsigned)(int)(ang * (0x40000000 / 90.));
		Printf("Angle = %.5f: xs_RoundToInt = %08x, unsigned cast = %08x, signed cast = %08x\n",
			ang, ang1, ang2, ang3);
	}
}